

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_19bb9b::ClangShellCommand::configureAttribute
          (ClangShellCommand *this,ConfigureContext *ctx,StringRef name,
          ArrayRef<llvm::StringRef> values)

{
  pointer *ppSVar1;
  pointer pSVar2;
  iterator __position;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t extraout_RDX;
  StringRef *pSVar5;
  StringRef *pSVar6;
  size_type __n;
  iterator __begin3;
  StringRef local_40;
  
  __n = values.Length;
  pSVar6 = values.Data;
  if ((name.Length == 4) && (*(int *)name.Data == 0x73677261)) {
    pSVar2 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar2) {
      (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar2;
    }
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::reserve(&this->args,__n);
    if (__n != 0) {
      pSVar5 = pSVar6 + __n;
      do {
        iVar4 = (*ctx->delegate->_vptr_BuildFileDelegate[2])
                          (ctx->delegate,pSVar6->Data,pSVar6->Length);
        local_40.Data = (char *)CONCAT44(extraout_var,iVar4);
        __position._M_current =
             (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
          _M_realloc_insert<llvm::StringRef>(&this->args,__position,&local_40);
        }
        else {
          (__position._M_current)->Data = local_40.Data;
          (__position._M_current)->Length = extraout_RDX;
          ppSVar1 = &(this->args).
                     super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != pSVar5);
    }
    return true;
  }
  bVar3 = llbuild::buildsystem::ExternalCommand::configureAttribute
                    (&this->super_ExternalCommand,ctx,name,values);
  return bVar3;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  ArrayRef<StringRef> values) override {
    if (name == "args") {
      args.clear();
      args.reserve(values.size());
      for (auto arg: values) {
        args.emplace_back(ctx.getDelegate().getInternedString(arg));
      }
    } else {
        return ExternalCommand::configureAttribute(ctx, name, values);
    }

    return true;
  }